

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::SpirVAssembly::InstanceContext>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::SpirVAssembly::InstanceContext> *this)

{
  InstanceContext IVar1;
  undefined8 in_stack_fffffffffffffec8;
  TestStatus *pTVar2;
  Context *pCVar3;
  InstanceContext *this_00;
  Function p_Var4;
  undefined1 in_stack_fffffffffffffef8 [176];
  undefined1 auVar5 [32];
  FunctionInstance1<vkt::SpirVAssembly::InstanceContext> *this_local;
  
  pCVar3 = (this->super_TestInstance).m_context;
  p_Var4 = (this->m_args).func;
  this_00 = (InstanceContext *)&stack0xffffffffffffff08;
  pTVar2 = __return_storage_ptr__;
  SpirVAssembly::InstanceContext::InstanceContext(this_00,&(this->m_args).arg0);
  IVar1.moduleMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = __return_storage_ptr__;
  IVar1.moduleMap._M_t._M_impl._0_8_ = in_stack_fffffffffffffec8;
  IVar1.moduleMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pTVar2;
  IVar1.moduleMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pCVar3;
  IVar1.moduleMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)this_00;
  IVar1.moduleMap._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)p_Var4;
  auVar5 = in_stack_fffffffffffffef8._144_32_;
  IVar1.inputColors[0].m_value = in_stack_fffffffffffffef8._0_4_;
  IVar1.inputColors[1].m_value = in_stack_fffffffffffffef8._4_4_;
  IVar1.inputColors[2].m_value = in_stack_fffffffffffffef8._8_4_;
  IVar1.inputColors[3].m_value = in_stack_fffffffffffffef8._12_4_;
  IVar1.outputColors[0].m_value = in_stack_fffffffffffffef8._16_4_;
  IVar1.outputColors[1].m_value = in_stack_fffffffffffffef8._20_4_;
  IVar1.outputColors[2].m_value = in_stack_fffffffffffffef8._24_4_;
  IVar1.outputColors[3].m_value = in_stack_fffffffffffffef8._28_4_;
  IVar1.testCodeFragments._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_fffffffffffffef8._32_48_;
  IVar1.specConstants._M_t._M_impl = (_Rep_type)(_Rep_type)in_stack_fffffffffffffef8._80_48_;
  IVar1.hasTessellation = (bool)in_stack_fffffffffffffef8[0x80];
  IVar1._177_3_ = in_stack_fffffffffffffef8._129_3_;
  IVar1.requiredStages = in_stack_fffffffffffffef8._132_4_;
  IVar1.failResult = in_stack_fffffffffffffef8._136_4_;
  IVar1._188_4_ = in_stack_fffffffffffffef8._140_4_;
  IVar1.failMessageTemplate._M_dataplus = (_Alloc_hider)auVar5[0];
  IVar1.failMessageTemplate._1_7_ = auVar5._1_7_;
  IVar1.failMessageTemplate._M_string_length = auVar5._8_8_;
  IVar1.failMessageTemplate.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
        )auVar5._16_16_;
  (*p_Var4)(pTVar2,pCVar3,IVar1);
  SpirVAssembly::InstanceContext::~InstanceContext((InstanceContext *)&stack0xffffffffffffff08);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }